

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python-puppet.hpp
# Opt level: O1

void henson::PythonPuppet::exec(void *self_)

{
  int iVar1;
  PyObject *pPVar2;
  object *poVar3;
  PyObject *pPVar4;
  ulong uVar5;
  PythonPuppet *self;
  list argv;
  timespec ts;
  handle local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [24];
  handle local_b0;
  object local_a8;
  handle local_a0;
  handle local_98;
  object local_90;
  long local_88;
  long local_80;
  handle local_78;
  object local_70;
  accessor<pybind11::detail::accessor_policies::str_attr> local_68;
  pybind11 local_48 [8];
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>> local_40 [8]
  ;
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>> local_38 [8]
  ;
  
  *(void **)((long)self_ + 0xb8) = self_;
  local_80 = (long)self_ + 0x58;
  local_88 = (long)self_ + 0x50;
  do {
    local_e0.m_ptr = (PyObject *)self_;
    pybind11::module_::import((module_ *)&local_a8,"pyhenson");
    local_d8._8_8_ = local_a8.super_handle.m_ptr;
    local_c8._0_8_ = "self";
    local_c8._8_8_ = (PyObject *)0x0;
    pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=
              ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_d8,(long *)&local_e0
              );
    pybind11::object::~object((object *)(local_c8 + 8));
    pybind11::object::~object(&local_a8);
    *(undefined1 *)((long)self_ + 0x20) = 1;
    clock_gettime(0,(timespec *)local_d8);
    *(PyObject **)((long)self_ + 0x30) =
         (PyObject *)(local_d8._8_8_ + local_d8._0_8_ * 62500000 * 0x10);
    pybind11::list::list<long,_0>((list *)&local_e0,0);
    pybind11::module_::import((module_ *)local_d8,"sys");
    iVar1 = PyObject_HasAttrString(local_d8._0_8_,"argv");
    pybind11::object::~object((object *)local_d8);
    if (iVar1 == 1) {
      pybind11::module_::import((module_ *)&local_a0,"sys");
      local_d8._8_8_ = local_a0.m_ptr;
      local_c8._0_8_ = "argv";
      local_c8._8_8_ = (PyObject *)0x0;
      pybind11::list::list<pybind11::detail::accessor_policies::str_attr>
                ((list *)&local_a8,
                 (accessor<pybind11::detail::accessor_policies::str_attr> *)local_d8);
      pybind11::object::operator=((object *)&local_e0,&local_a8);
      pybind11::object::~object(&local_a8);
      pybind11::object::~object((object *)(local_c8 + 8));
      pybind11::object::~object((object *)&local_a0);
    }
    else {
      pybind11::module_::import((module_ *)local_d8,"sys");
      pybind11::module_::add_object((module_ *)local_d8,"argv",local_e0,false);
      pybind11::object::~object((object *)local_d8);
    }
    local_d8._8_8_ = local_e0.m_ptr;
    local_c8._0_8_ = "clear";
    local_c8._8_8_ = (PyObject *)0x0;
    pybind11::detail::
    object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
    operator()(local_38);
    pybind11::object::~object((object *)local_38);
    pybind11::object::~object((object *)(local_c8 + 8));
    if (*(long *)((long)self_ + 0xa8) != *(long *)((long)self_ + 0xa0)) {
      uVar5 = 0;
      do {
        local_d8._8_8_ = local_e0.m_ptr;
        local_c8._0_8_ = (long)"vector::_M_default_append" + 0x13;
        local_c8._8_8_ = (PyObject *)0x0;
        pybind11::detail::
        object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
        operator()(local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_d8);
        pybind11::object::~object((object *)local_40);
        pybind11::object::~object((object *)(local_c8 + 8));
        uVar5 = uVar5 + 1;
      } while (uVar5 < (ulong)(*(long *)((long)self_ + 0xa8) - *(long *)((long)self_ + 0xa0) >> 5));
    }
    local_d8._0_8_ = (PyObject *)0x0;
    local_b0.m_ptr = *(PyObject **)((long)self_ + 0x78);
    pybind11::str::str<unsigned_long,_0>
              ((str *)&local_90,*(char **)((long)self_ + 0x70),(unsigned_long *)&local_b0);
    pPVar2 = (PyObject *)PyEval_GetGlobals();
    pPVar4 = pPVar2;
    if (pPVar2 == (PyObject *)0x0) {
      pybind11::module_::import((module_ *)&local_98,"__main__");
      local_68.obj.m_ptr = local_98.m_ptr;
      local_68.key = "__dict__";
      local_68.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
      poVar3 = pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                         (&local_68);
      pPVar4 = (poVar3->super_handle).m_ptr;
    }
    if (pPVar4 != (PyObject *)0x0) {
      pPVar4->ob_refcnt = pPVar4->ob_refcnt + 1;
    }
    local_b0.m_ptr = pPVar4;
    if (pPVar2 == (PyObject *)0x0) {
      pybind11::object::~object(&local_68.cache);
      pybind11::object::~object((object *)&local_98);
    }
    local_70.super_handle.m_ptr = (handle)(handle)local_b0.m_ptr;
    local_b0.m_ptr = (PyObject *)0x0;
    local_78.m_ptr = (PyObject *)local_d8._0_8_;
    if ((PyObject *)local_d8._0_8_ != (PyObject *)0x0) {
      *(long *)local_d8._0_8_ = *(long *)local_d8._0_8_ + 1;
    }
    pybind11::eval_file<(pybind11::eval_mode)2>
              (local_48,(str *)&local_90,&local_70,(object *)&local_78);
    pybind11::object::~object((object *)local_48);
    pybind11::object::~object((object *)&local_78);
    pybind11::object::~object(&local_70);
    pybind11::object::~object((object *)&local_b0);
    pybind11::object::~object(&local_90);
    pybind11::object::~object((object *)local_d8);
    pybind11::object::~object((object *)&local_e0);
    *(undefined1 *)((long)self_ + 0x20) = 0;
    coro_transfer(local_80,local_88);
  } while( true );
}

Assistant:

static void         exec(void* self_)
    {
        PythonPuppet* self = (PythonPuppet*) self_;
        self->self = self;

        while(true)
        {
            {
                // we can have only one PythonPuppet (otherwise scoped_interpreter
                // will complain), so there is only one pyhenson module, with only
                // one self to modify
                py::module::import("pyhenson").attr("self") = reinterpret_cast<intptr_t>(self_);

                self->running_ = true;
                self->start_time_ = get_time();
                try
                {
                    py::list argv;
                    if (py::hasattr(py::module::import("sys"), "argv")) {
                        argv = py::module::import("sys").attr("argv");
                    } else {
                        py::module::import("sys").add_object("argv", argv);
                    }
                    argv.attr("clear")();
                    for(size_t i = 0; i < self->arguments_.size(); ++i)
                    {
                        auto& arg = self->arguments_[i];
                        argv.attr("append")(arg);
                    }

                    py::object locals;
                    py::eval_file(self->filename_, py::globals(), locals);
                } catch (const py::error_already_set& e)
                {
                    self->log_->info("Caught error_already_set (maybe SystemExit; check debug channel for details)");
                    self->log_->debug("  {}", e.what());
                }
                catch (const std::exception& e)
                {
                    self->log_->warn("Got exception from Python: {}", e.what());
                }
                self->running_ = false;
            }

            self->yield();      // the time for the final portion will get recorded thanks to this call
        }
    }